

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter
          (ScopedFakeTestPartResultReporter *this)

{
  Mutex *this_00;
  TestPartResultReporterInterface *pTVar1;
  UnitTestImpl *pUVar2;
  TestPartResultReporterInterface **ppTVar3;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__ScopedFakeTestPartResultReporter_0013d0e0;
  UnitTest::GetInstance();
  pUVar2 = UnitTest::GetInstance::instance.impl_;
  pTVar1 = this->old_reporter_;
  if (this->intercept_mode_ == INTERCEPT_ALL_THREADS) {
    this_00 = &(UnitTest::GetInstance::instance.impl_)->global_test_part_result_reporter_mutex_;
    internal::MutexBase::Lock(&this_00->super_MutexBase);
    pUVar2->global_test_part_result_repoter_ = pTVar1;
    internal::MutexBase::Unlock(&this_00->super_MutexBase);
    return;
  }
  ppTVar3 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (&(UnitTest::GetInstance::instance.impl_)->
                        per_thread_test_part_result_reporter_);
  *ppTVar3 = pTVar1;
  return;
}

Assistant:

ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    impl->SetGlobalTestPartResultReporter(old_reporter_);
  } else {
    impl->SetTestPartResultReporterForCurrentThread(old_reporter_);
  }
}